

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O0

_Bool q_resize(queue *q,size_t size)

{
  uintptr_t *puVar1;
  ulong local_50;
  long local_48;
  size_t head_sz;
  uintptr_t *new_data;
  size_t size_local;
  queue *q_local;
  
  if (size < 0x1fffffffffffffff) {
    if (q->size == 0) {
      __assert_fail("q->size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-queue.c"
                    ,0x32,"_Bool q_resize(struct queue *, size_t)");
    }
    if (((size < q->size - 1) && (q->head != q->tail)) && ((size < q->head || (size < q->tail)))) {
      puVar1 = (uintptr_t *)mem_alloc((size + 1) * 8);
      if (q->head < q->tail) {
        if (size + 1 < q->tail - q->head) {
          local_48 = size + 1;
        }
        else {
          local_48 = q->tail - q->head;
        }
        memcpy(puVar1,q->data + q->head,local_48 << 3);
        q->tail = q->tail - q->head;
      }
      else {
        if (size + 1 < q->size - q->head) {
          local_50 = size + 1;
        }
        else {
          local_50 = q->size - q->head;
        }
        memcpy(puVar1,q->data + q->head,local_50 << 3);
        if (local_50 < size + 1) {
          memcpy(puVar1 + local_50,q->data,((size + 1) - local_50) * 8);
        }
        q->tail = size;
      }
      q->head = 0;
      mem_free(q->data);
      q->data = puVar1;
    }
    else {
      puVar1 = (uintptr_t *)mem_realloc(q->data,(size + 1) * 8);
      q->data = puVar1;
    }
    q->size = size + 1;
    q_local._7_1_ = false;
  }
  else {
    q_local._7_1_ = true;
  }
  return q_local._7_1_;
}

Assistant:

bool q_resize(struct queue *q, size_t size) {
	if (size > SIZE_MAX / sizeof(uintptr_t) - 1) {
		return true;
	}
	assert(q->size > 0);
	if (size < q->size - 1 && q->head != q->tail
			&& (q->head > size || q->tail > size)) {
		uintptr_t *new_data = mem_alloc(sizeof(uintptr_t) * (size + 1));

		if (q->tail > q->head) {
			memcpy(new_data, q->data + q->head,
				MIN(q->tail - q->head, size + 1)
				* sizeof(uintptr_t));
			q->tail -= q->head;
		} else {
			size_t head_sz = MIN(q->size - q->head, size + 1);

			memcpy(new_data, q->data + q->head, head_sz
				* sizeof(uintptr_t));
			if (head_sz < size + 1) {
				memcpy(new_data + head_sz, q->data,
					(size + 1 - head_sz)
					* sizeof(uintptr_t));
			}
			q->tail = size;
		}
		q->head = 0;
		mem_free(q->data);
		q->data = new_data;
	} else {
		q->data = mem_realloc(q->data, sizeof(uintptr_t) * (size + 1));
	}
	q->size = size + 1;
	return false;
}